

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_net.c
# Opt level: O1

void socket_close(int socket)

{
  if (socket < 0) {
    return;
  }
  close(socket);
  return;
}

Assistant:

void socket_close(int socket)
{
#ifdef _WIN32
    closesocket(socket);
#else
    if (socket < 0) return;
    close(socket);
#endif
}